

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

void emitASMArray(vector<unsigned_char,_std::allocator<unsigned_char>_> *data,string *name,
                 ostream *os)

{
  long lVar1;
  ostream oVar2;
  ostream *poVar3;
  pointer puVar4;
  
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  if ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    puVar4 = (pointer)0x0;
    do {
      if (((ulong)puVar4 & 0xf) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n\tDB ",5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"$",1);
      poVar3 = os + *(long *)(*(long *)os + -0x18);
      if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar3);
        poVar3[0xe0] = oVar2;
        poVar3[0xe1] = (ostream)0x1;
      }
      poVar3[0xe0] = (ostream)0x30;
      lVar1 = *(long *)os;
      *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 0x10) = 2;
      *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) | 0x4000;
      std::ostream::operator<<
                ((ostream *)os,
                 (uint)puVar4[(long)(data->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start]);
      if (puVar4 != (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish +
                    ~(ulong)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            )._M_impl.super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 < (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish +
                      -(long)(data->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return;
}

Assistant:

void emitASMArray(
	const std::vector<unsigned char> &data,
	const std::string &name,
	std::ostream &os
) {
	os << name << ":";
	for(size_t i = 0; i < data.size(); ++i) {
		if(i % 16 == 0) os << "\n\tDB ";
		os << "$" << std::setfill('0') << std::setw(2) << std::hex << std::uppercase << (int)data[i];
		if(i != data.size()-1) os << ", ";
	}
	os << std::endl;
}